

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_poll_init(void)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  epoll_event chevent;
  uint32_t local_24;
  int local_20;
  
  lVar3 = 0;
  do {
    if (*(int *)((long)evio_fd + lVar3) != -1) {
      close(*(int *)((long)evio_fd + lVar3));
      *(undefined4 *)((long)evio_fd + lVar3) = 0xffffffff;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  lVar3 = 0;
  do {
    iVar1 = epoll_create1(0x80000);
    *(int *)((long)evio_fd + lVar3) = iVar1;
    if (iVar1 == -1) goto LAB_0010a38d;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  lVar3 = 0;
  while( true ) {
    local_24 = 5;
    local_20 = evio_fd[lVar3 + 1];
    iVar1 = epoll_ctl(evio_fd[0],1,local_20,(epoll_event *)&local_24);
    if (iVar1 == -1) break;
    lVar3 = lVar3 + 1;
    if (lVar3 == 2) {
      return;
    }
  }
LAB_0010a38d:
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: couldn\'t initialize epoll.");
  }
  fio_poll_close();
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static void fio_poll_init(void) {
  fio_poll_close();
  for (int i = 0; i < 3; ++i) {
    evio_fd[i] = epoll_create1(EPOLL_CLOEXEC);
    if (evio_fd[i] == -1)
      goto error;
  }
  for (int i = 1; i < 3; ++i) {
    struct epoll_event chevent = {
        .events = (EPOLLOUT | EPOLLIN),
        .data.fd = evio_fd[i],
    };
    if (epoll_ctl(evio_fd[0], EPOLL_CTL_ADD, evio_fd[i], &chevent) == -1)
      goto error;
  }
  return;
error:
  FIO_LOG_FATAL("couldn't initialize epoll.");
  fio_poll_close();
  exit(errno);
  return;
}